

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export_strings.cpp
# Opt level: O3

char * __thiscall
pstore::exchange::export_ns::string_mapping::index(string_mapping *this,char *__s,int __c)

{
  __node_base_ptr p_Var1;
  key_type local_8;
  
  local_8.a_ = (value_type)__s;
  p_Var1 = std::
           _Hashtable<pstore::address,_std::pair<const_pstore::address,_unsigned_long>,_std::allocator<std::pair<const_pstore::address,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<pstore::address>,_std::hash<pstore::address>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node
                     ((_Hashtable<pstore::address,_std::pair<const_pstore::address,_unsigned_long>,_std::allocator<std::pair<const_pstore::address,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<pstore::address>,_std::hash<pstore::address>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)this,(ulong)__s % (this->strings_)._M_h._M_bucket_count,&local_8,
                      (__hash_code)__s);
  if ((p_Var1 != (__node_base_ptr)0x0) && (p_Var1->_M_nxt != (_Hash_node_base *)0x0)) {
    return (char *)p_Var1->_M_nxt[2]._M_nxt;
  }
  assert_failed("pos != strings_.end ()",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/exchange/export_strings.cpp"
                ,0x2b);
}

Assistant:

std::uint64_t string_mapping::index (typed_address<indirect_string> const addr) const {
                auto const pos = strings_.find (addr.to_address ());
                PSTORE_ASSERT (pos != strings_.end ());
                return pos->second;
            }